

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

void __thiscall
ot::commissioner::CommissionerImpl::Connect
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aAddr,uint16_t aPort)

{
  function<void_(ot::commissioner::Error)> *this_00;
  anon_class_40_2_3adf01b8 onConnected;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  _Any_data local_48;
  code *local_38;
  CommissionerImpl *local_28;
  
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)&local_48,aHandler);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_28 = this;
  this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x28);
  std::function<void_(ot::commissioner::Error)>::function
            (this_00,(function<void_(ot::commissioner::Error)> *)&local_48);
  *(CommissionerImpl **)&this_00[1].super__Function_base._M_functor = local_28;
  pcStack_50 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:318:24)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:318:24)>
             ::_M_manager;
  local_68._M_unused._M_object = this_00;
  coap::CoapSecure::Connect(&this->mBrClient,(ConnectHandler *)&local_68,aAddr,aPort);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void CommissionerImpl::Connect(ErrorHandler aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [&, aHandler](const DtlsSession &, Error aError) {
        if (aError == ErrorCode::kNone)
        {
            this->mState = State::kConnected;
        }
        aHandler(aError);
    };
    mBrClient.Connect(onConnected, aAddr, aPort);
}